

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

int32_t __thiscall icu_63::Package::findNextItem(Package *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *__s1;
  char *__s1_00;
  char *__s;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  Item *pIVar11;
  
  lVar10 = (long)this->findNextIndex;
  if (-1 < lVar10) {
    iVar1 = this->itemCount;
    iVar2 = this->findPrefixLength;
    uVar3 = this->findSuffixLength;
    __s1 = this->findPrefix;
    __s1_00 = this->findSuffix;
    uVar4 = this->matchMode;
    pIVar11 = this->items + lVar10;
    for (; lVar10 < iVar1; lVar10 = lVar10 + 1) {
      iVar5 = (int)lVar10;
      this->findNextIndex = iVar5 + 1;
      __s = pIVar11->name;
      sVar7 = strlen(__s);
      iVar9 = (int)sVar7;
      if ((int)(iVar2 + uVar3) <= iVar9) {
        if ((0 < iVar2) && (iVar6 = bcmp(__s1,__s,(long)iVar2), iVar6 != 0)) break;
        if (((int)uVar3 < 1) ||
           (iVar6 = bcmp(__s1_00,__s + (int)(iVar9 - uVar3),(ulong)uVar3), iVar6 == 0)) {
          if ((uVar4 & 1) == 0) {
            return iVar5;
          }
          pcVar8 = strchr(__s + iVar2,0x2f);
          if (pcVar8 == (char *)0x0) {
            return iVar5;
          }
          if ((long)(int)(iVar9 - (iVar2 + uVar3)) <= (long)pcVar8 - (long)(__s + iVar2)) {
            return iVar5;
          }
        }
      }
      pIVar11 = pIVar11 + 1;
    }
    this->findNextIndex = -1;
  }
  return -1;
}

Assistant:

int32_t
Package::findNextItem() {
    const char *name, *middle, *treeSep;
    int32_t idx, nameLength, middleLength;

    if(findNextIndex<0) {
        return -1;
    }

    while(findNextIndex<itemCount) {
        idx=findNextIndex++;
        name=items[idx].name;
        nameLength=(int32_t)strlen(name);
        if(nameLength<(findPrefixLength+findSuffixLength)) {
            // item name too short for prefix & suffix
            continue;
        }
        if(findPrefixLength>0 && 0!=memcmp(findPrefix, name, findPrefixLength)) {
            // left the range of names with this prefix
            break;
        }
        middle=name+findPrefixLength;
        middleLength=nameLength-findPrefixLength-findSuffixLength;
        if(findSuffixLength>0 && 0!=memcmp(findSuffix, name+(nameLength-findSuffixLength), findSuffixLength)) {
            // suffix does not match
            continue;
        }
        // prefix & suffix match

        if(matchMode&MATCH_NOSLASH) {
            treeSep=strchr(middle, U_TREE_ENTRY_SEP_CHAR);
            if(treeSep!=NULL && (treeSep-middle)<middleLength) {
                // the middle (matching the * wildcard) contains a tree separator /
                continue;
            }
        }

        // found a matching item
        return idx;
    }

    // no more items
    findNextIndex=-1;
    return -1;
}